

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O0

CmdLine * __thiscall
Args::details::
API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
::addArgWithFlagAndName<char_const(&)[11]>
          (API<Args::CmdLine,_Args::CmdLine,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_true>
           *this,Char flag,char (*name) [11],bool isWithValue,bool isRequired,String *desc,
          String *longDesc,String *defaultValue,String *valueSpecifier)

{
  byte bVar1;
  ulong uVar2;
  pointer pAVar3;
  byte in_CL;
  byte bVar4;
  long in_RDI;
  byte in_R8B;
  undefined8 in_R9;
  Char flag_00;
  undefined8 in_stack_00000010;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> a;
  CmdLine *in_stack_00000050;
  unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> arg;
  pointer in_stack_ffffffffffffff68;
  CmdLine *pCVar5;
  Arg *in_stack_ffffffffffffff70;
  unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *this_00;
  unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *in_stack_ffffffffffffff78;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *in_stack_ffffffffffffff80;
  unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> local_58;
  Deleter<Args::ArgIface> local_45 [19];
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  char (*in_stack_ffffffffffffffd0) [11];
  undefined6 in_stack_ffffffffffffffe0;
  
  flag_00 = (Char)((ulong)in_R9 >> 0x38);
  bVar4 = in_CL & 1;
  bVar1 = in_R8B & 1;
  operator_new(0xf8);
  Arg::Arg<char_const(&)[11]>
            ((Arg *)CONCAT17(bVar4,CONCAT16(bVar1,in_stack_ffffffffffffffe0)),flag_00,
             in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf,
             (bool)in_stack_ffffffffffffffce);
  Deleter<Args::ArgIface>::Deleter(local_45,true);
  std::unique_ptr<Args::Arg,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::details::Deleter<Args::ArgIface>,void>
            ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (__enable_if_t<_is_lvalue_reference<Deleter<ArgIface>_>::value,_Args::details::Deleter<Args::ArgIface>_&&>
              )0x15a19a);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)0x15a1b2);
    Arg::setDescription(in_stack_ffffffffffffff70,(String *)in_stack_ffffffffffffff68);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)0x15a213);
    Arg::setLongDescription(in_stack_ffffffffffffff70,(String *)in_stack_ffffffffffffff68);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pAVar3 = std::unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_>::operator->
                       ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)0x15a242);
    (*(pAVar3->super_ArgIface)._vptr_ArgIface[0x16])(pAVar3,in_stack_00000010);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_> *)0x15a278);
    Arg::setValueSpecifier(in_stack_ffffffffffffff70,(String *)in_stack_ffffffffffffff68);
  }
  this_00 = &local_58;
  std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::Arg,Args::details::Deleter<Args::ArgIface>,void>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00,
             (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             in_stack_ffffffffffffff68);
  CmdLine::addArg(in_stack_00000050,
                  (ArgPtr *)
                  a._M_t.
                  super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
                  super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  pCVar5 = *(CmdLine **)(in_RDI + 8);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  std::unique_ptr<Args::Arg,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr(this_00);
  return pCVar5;
}

Assistant:

PARENT & addArgWithFlagAndName(
		//! Flag for this argument.
		Char flag,
		//! Name for this argument.
		NAME && name,
		//! Is this argument with value?
		bool isWithValue = false,
		//! Is this argument required?
		bool isRequired = false,
		//! Description of the argument.
		const String & desc = String(),
		//! Long description.
		const String & longDesc = String(),
		//! Default value.
		const String & defaultValue = String(),
		//! Value specifier.
		const String & valueSpecifier = String() )
	{

		auto arg = std::unique_ptr< Arg, details::Deleter< ArgIface > > (
			new Arg( flag, std::forward< NAME > ( name ), isWithValue,
				isRequired ),
			details::Deleter< ArgIface > ( true ) );

		if( !desc.empty() )
			arg->setDescription( desc );

		if( !longDesc.empty() )
			arg->setLongDescription( longDesc );

		if( !defaultValue.empty() )
			arg->setDefaultValue( defaultValue );

		if( !valueSpecifier.empty() )
			arg->setValueSpecifier( valueSpecifier );

		ARGPTR a = std::move( arg );

		m_self.addArg( std::move( a ) );

		return m_parent;
	}